

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall InterpreterTestSuite::InitContext(InterpreterTestSuite *this,TestContext *ctx)

{
  initializer_list<unsigned_char> __l;
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  CommissionerAppStaticExpecter *this_01;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_03;
  element_type *peVar3;
  element_type *peVar4;
  uchar local_29a [2];
  iterator local_298;
  size_type local_290;
  AssertHelper local_288;
  Message local_280;
  ErrorCode local_278;
  ErrorCode local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_2;
  string local_258;
  allocator local_231;
  string local_230;
  undefined1 local_210 [8];
  Error result;
  ReturnAction<ot::commissioner::Error> local_1c0;
  anon_class_8_1_ba1d3d87_for_action local_1b0;
  anon_class_8_1_ba1d3d87_for_action local_1a8;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:110:34),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_1a0;
  Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_188;
  WithoutMatchers local_161;
  Matcher<const_ot::commissioner::Config_&> local_160;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_148;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_130;
  AssertHelper local_f8;
  Message local_f0;
  void *local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_c8;
  Message local_c0;
  ErrorCode local_b8;
  ErrorCode local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  string local_98;
  undefined1 local_78 [8];
  Error error;
  allocator local_39;
  undefined1 local_38 [8];
  string configFile;
  TestContext *ctx_local;
  InterpreterTestSuite *this_local;
  
  configFile.field_2._8_8_ = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"./tmp/config",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"{\"ThreadSMRoot\": \"./tmp\"}",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ot::commissioner::WriteFile((Error *)local_78,&local_98,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_b4 = ot::commissioner::Error::GetCode((Error *)local_78);
  local_b8 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_b0,"error.GetCode()","ErrorCode::kNone",&local_b4,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_e8 = (void *)0x0;
    testing::internal::CmpHelperNE<std::shared_ptr<CommissionerAppMock>,decltype(nullptr)>
              ((internal *)local_e0,"ctx.mDefaultCommissionerObject","nullptr",
               (shared_ptr<CommissionerAppMock> *)(configFile.field_2._8_8_ + 0xd0),&local_e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0x6a,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message(&local_f0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      this_01 = (CommissionerAppStaticExpecter *)(configFile.field_2._8_8_ + 0xe0);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_148,(AnythingMatcher *)&testing::_);
      testing::internal::AnythingMatcher::operator_cast_to_Matcher
                (&local_160,(AnythingMatcher *)&testing::_);
      CommissionerAppStaticExpecter::gmock_Create(&local_130,this_01,&local_148,&local_160);
      testing::internal::GetWithoutMatchers();
      this_02 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::operator()(&local_130,&local_161,(void *)0x0);
      pcVar2 = "ctx.mCommissionerAppStaticExpecter";
      this_03 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::InternalExpectedAt
                          (this_02,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x6c,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      local_1b0.ctx = (TestContext *)configFile.field_2._8_8_;
      local_1a8.ctx =
           (TestContext *)
           testing::
           WithArg<0ul,InterpreterTestSuite::InitContext(InterpreterTestSuite::TestContext&)::_lambda(std::shared_ptr<ot::commissioner::CommissionerApp>&)_1_>
                     (&local_1b0);
      ot::commissioner::Error::Error((Error *)((long)&result.mMessage.field_2 + 8));
      testing::Return<ot::commissioner::Error>
                ((testing *)&local_1c0,(Error *)((long)&result.mMessage.field_2 + 8));
      testing::
      DoAll<testing::internal::WithArgsAction<InterpreterTestSuite::InitContext(InterpreterTestSuite::TestContext&)::_lambda(std::shared_ptr<ot::commissioner::CommissionerApp>&)_1_,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                (&local_1a0,(testing *)&local_1a8,
                 (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:110:34),_0UL>
                  *)&local_1c0,(ReturnAction<ot::commissioner::Error> *)pcVar2);
      testing::internal::DoAllAction::operator_cast_to_Action(&local_188,(DoAllAction *)&local_1a0);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillOnce(this_03,&local_188);
      testing::
      Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~Action(&local_188);
      testing::internal::
      DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:110:34),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
      ::~DoAllAction(&local_1a0);
      testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_1c0);
      ot::commissioner::Error::~Error((Error *)((long)&result.mMessage.field_2 + 8));
      testing::internal::
      MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::~MockSpec(&local_130);
      testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_160);
      testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher(&local_148);
      this_00 = configFile.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_230,"./tmp/config",&local_231);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_258,"",
                 (allocator *)
                 ((long)&gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      ot::commissioner::Interpreter::Init
                ((Error *)local_210,(Interpreter *)this_00,&local_230,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      local_274 = ot::commissioner::Error::GetCode((Error *)local_210);
      local_278 = kNone;
      testing::internal::EqHelper::
      Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                ((EqHelper *)local_270,"result.GetCode()","ErrorCode::kNone",&local_274,&local_278);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
      if (!bVar1) {
        testing::Message::Message(&local_280);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
        testing::internal::AssertHelper::AssertHelper
                  (&local_288,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x72,pcVar2);
        testing::internal::AssertHelper::operator=(&local_288,&local_280);
        testing::internal::AssertHelper::~AssertHelper(&local_288);
        testing::Message::~Message(&local_280);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        peVar3 = std::
                 __shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                 ::get((__shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                        *)(configFile.field_2._8_8_ + 0x88));
        *(element_type **)(configFile.field_2._8_8_ + 200) = peVar3;
        local_29a[0] = '1';
        local_29a[1] = 0x30;
        local_298 = local_29a;
        local_290 = 2;
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(configFile.field_2._8_8_ + 0x78));
        __l._M_len = local_290;
        __l._M_array = local_298;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&(peVar4->mDefaultConf).mPSKc,__l);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      ot::commissioner::Error::~Error((Error *)local_210);
    }
  }
  ot::commissioner::Error::~Error((Error *)local_78);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void InitContext(TestContext &ctx)
    {
        // Minimum test setup: create config file
        const std::string configFile = "./tmp/config";
        auto              error      = WriteFile("{\"ThreadSMRoot\": \"./tmp\"}", configFile);
        ASSERT_EQ(error.GetCode(), ErrorCode::kNone);

        ASSERT_NE(ctx.mDefaultCommissionerObject, nullptr);

        EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
            .WillOnce(
                DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = ctx.mDefaultCommissionerObject; }),
                      Return(Error{})));

        auto result = ctx.mInterpreter.Init("./tmp/config", "");
        ASSERT_EQ(result.GetCode(), ErrorCode::kNone);

        ctx.mRegistry = ctx.mInterpreter.mRegistry.get();

        // Add formal default PSKc
        ctx.mInterpreter.mJobManager->mDefaultConf.mPSKc = {'1', '0'};
    }